

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::UnlockedPoolAllocator::fastFree(UnlockedPoolAllocator *this,void *ptr)

{
  bool bVar1;
  pointer ppVar2;
  void *in_RSI;
  const_iterator in_RDI;
  pair<unsigned_long,_void_*> pVar3;
  size_t size;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff98;
  _List_node_base **__y;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffffa0;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_38;
  unsigned_long local_30;
  _Self local_28;
  _Self local_20;
  void *local_18;
  void *local_8;
  
  local_18 = in_RSI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      fprintf(_stderr,"FATAL ERROR! unlocked pool allocator get wild %p",local_18);
      fprintf(_stderr,"\n");
      local_8 = local_18;
      if (local_18 != (void *)0x0) {
        free(local_18);
      }
      return;
    }
    ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x178ca3);
    if (ppVar2->second == local_18) break;
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_20);
  }
  ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x178cbc);
  local_30 = ppVar2->first;
  __y = &(in_RDI._M_node)->_M_prev[2]._M_prev;
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_38,&local_20);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (in_stack_ffffffffffffffa0,in_RDI);
  pVar3 = std::make_pair<unsigned_long&,void*&>
                    ((unsigned_long *)((in_RDI._M_node)->_M_prev + 1),__y);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             *)pVar3.first,(value_type *)in_RDI._M_node);
  return;
}

Assistant:

void UnlockedPoolAllocator::fastFree(void* ptr)
{
    // return to budgets
    std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
    for (; it != d->payouts.end(); ++it)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            d->payouts.erase(it);

            d->budgets.push_back(std::make_pair(size, ptr));

            return;
        }
    }

    NCNN_LOGE("FATAL ERROR! unlocked pool allocator get wild %p", ptr);
    ncnn::fastFree(ptr);
}